

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O3

void mpp_sthd_grp_stop_sync(MppSThdGrp grp)

{
  uint uVar1;
  char *pcVar2;
  pthread_t *ppVar3;
  long lVar4;
  void *dummy;
  void *local_30;
  
  if (grp == (MppSThdGrp)0x0) {
    _mpp_log_l(2,"mpp_thread","Assertion %s failed at %s:%d\n",(char *)0x0,"impl",
               "mpp_sthd_grp_stop_sync",0x27d);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
  }
  pthread_mutex_lock((pthread_mutex_t *)((long)grp + 0x18));
  uVar1 = *(uint *)((long)grp + 0x14);
  if ((ulong)uVar1 == 4) {
    if (0 < *(int *)((long)grp + 0x10)) {
      ppVar3 = (pthread_t *)((long)grp + 0x58);
      lVar4 = 0;
      do {
        pthread_join(*ppVar3,&local_30);
        *(undefined4 *)(ppVar3 + -1) = 1;
        lVar4 = lVar4 + 1;
        ppVar3 = ppVar3 + 0x11;
      } while (lVar4 < *(int *)((long)grp + 0x10));
    }
    *(undefined4 *)((long)grp + 0x14) = 1;
  }
  else {
    if ((int)uVar1 < 5) {
      pcVar2 = *(char **)(state2str(MppSThdStatus_e)::strof_sthd_status + (ulong)uVar1 * 8);
    }
    else {
      pcVar2 = "invalid";
    }
    _mpp_log_l(2,"mpp_thread","%s can NOT stop sync on %s\n",(char *)0x0,grp,pcVar2);
  }
  pthread_mutex_unlock((pthread_mutex_t *)((long)grp + 0x18));
  return;
}

Assistant:

void mpp_sthd_grp_stop_sync(MppSThdGrp grp)
{
    MppSThdGrpImpl *impl = (MppSThdGrpImpl *)grp;
    MppSThdStatus status;

    mpp_assert(impl);

    /* we can only change callback function on uninit */
    pthread_mutex_lock(&impl->lock);
    status = impl->status;
    switch (status) {
    case MPP_STHD_STOPPING : {
        void *dummy;
        RK_S32 i;

        status = MPP_STHD_STOPPING;
        for (i = 0; i < impl->count; i++) {
            MppSThdImpl *thd = &impl->thds[i];

            pthread_join(thd->thd, &dummy);
            thd->status = MPP_STHD_READY;
        }
        impl->status = MPP_STHD_READY;
    } break;
    default : {
        mpp_err("%s can NOT stop sync on %s\n", impl->name, state2str(status));
    } break;
    }
    pthread_mutex_unlock(&impl->lock);
}